

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Heuristics.h
# Opt level: O2

void __thiscall Heuristics::Heuristics(Heuristics *this)

{
  (this->visited).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->visited).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->visited).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::stack<Table,std::deque<Table,std::allocator<Table>>>::
  stack<std::deque<Table,std::allocator<Table>>,void>(&this->frontier);
  std::queue<Table,std::deque<Table,std::allocator<Table>>>::
  queue<std::deque<Table,std::allocator<Table>>,void>(&this->frontierQ);
  (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->evaluatedChildren).super__Vector_base<Table,_std::allocator<Table>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Table::Table(&this->targetState);
  (this->targetState).table[0][0] = '1';
  (this->targetState).table[0][1] = '2';
  (this->targetState).table[0][2] = '3';
  (this->targetState).table[1][0] = '4';
  (this->targetState).table[1][1] = '5';
  (this->targetState).table[1][2] = '6';
  (this->targetState).table[2][0] = '7';
  (this->targetState).table[2][1] = '8';
  (this->targetState).table[2][2].number = ' ';
  return;
}

Assistant:

Heuristics(){
        targetState.table[0][0] = Cell('1');
        targetState.table[0][1] = Cell('2');
        targetState.table[0][2] = Cell('3');
        targetState.table[1][0] = Cell('4');
        targetState.table[1][1] = Cell('5');
        targetState.table[1][2] = Cell('6');
        targetState.table[2][0] = Cell('7');
        targetState.table[2][1] = Cell('8');
        targetState.table[2][2] = Cell(' ');
    }